

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::flush
          (xml_buffered_writer *this,char_t *data,size_t size)

{
  ushort *puVar1;
  byte bVar2;
  xml_encoding xVar3;
  long lVar4;
  value_type puVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  anon_union_8192_4_fbc60714_for_scratch *paVar6;
  anon_union_8192_4_fbc60714_for_scratch *result;
  xml_writer *pxVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  uint32_t *dest;
  
  if (size == 0) {
    return;
  }
  xVar3 = this->encoding;
  if (xVar3 == encoding_utf8) {
    pxVar7 = this->writer;
    UNRECOVERED_JUMPTABLE = pxVar7->_vptr_xml_writer[2];
    result = (anon_union_8192_4_fbc60714_for_scratch *)data;
    goto LAB_0011bf34;
  }
  result = &this->scratch;
  if ((xVar3 & ~encoding_utf8) == encoding_utf16_le) {
    lVar4 = 0x800;
    do {
      bVar2 = (byte)*(uint *)data;
      if ((char)bVar2 < '\0') {
        uVar8 = (uint)bVar2;
        if (((size == 1) || ((uVar8 & 0xffffffe0) != 0xc0)) ||
           ((*(byte *)((long)data + 1) & 0xc0) != 0x80)) {
          if (((size < 3) || ((uVar8 & 0xfffffff0) != 0xe0)) ||
             (((*(byte *)((long)data + 1) & 0xffc0) != 0x80 ||
              ((*(byte *)((long)data + 2) & 0xc0) != 0x80)))) {
            if (((size < 4) || ((uVar8 & 0xfffffff8) != 0xf0)) ||
               (((*(byte *)((long)data + 1) & 0xffffffc0) != 0x80 ||
                (((*(byte *)((long)data + 2) & 0xc0) != 0x80 ||
                 (bVar2 = *(byte *)((long)data + 3), (bVar2 & 0xc0) != 0x80)))))) {
              data = (char_t *)((long)data + 1);
              size = size - 1;
            }
            else {
              uVar10 = (uint)*(byte *)((long)data + 2) << 6;
              *(short *)(this->buffer + lVar4) =
                   (short)((uVar10 & 0xc00) +
                           ((*(byte *)((long)data + 1) & 0x3f) << 0xc | (uVar8 & 7) << 0x12) +
                           0x3ff0000 >> 10) + -0x2800;
              *(ushort *)(this->buffer + lVar4 + 2) = bVar2 & 0x3f | (ushort)uVar10 & 0x3ff | 0xdc00
              ;
              lVar4 = lVar4 + 4;
              data = (char_t *)((long)data + 4);
              size = size - 4;
            }
          }
          else {
            *(ushort *)(this->buffer + lVar4) =
                 *(byte *)((long)data + 2) & 0x3f |
                 (*(byte *)((long)data + 1) & 0x3f) << 6 | (ushort)bVar2 << 0xc;
            lVar4 = lVar4 + 2;
            data = (char_t *)((long)data + 3);
            size = size - 3;
          }
        }
        else {
          *(ushort *)(this->buffer + lVar4) =
               *(byte *)((long)data + 1) & 0x3f | (ushort)((uVar8 & 0x1f) << 6);
          lVar4 = lVar4 + 2;
          data = (char_t *)((long)data + 2);
          size = size - 2;
        }
      }
      else {
        *(ushort *)(this->buffer + lVar4) = (ushort)bVar2;
        lVar4 = lVar4 + 2;
        data = (char_t *)((long)data + 1);
        size = size - 1;
        if ((3 < size) && (((ulong)data & 3) == 0)) {
          do {
            if ((*(uint *)data & 0x80808080) != 0) break;
            *(ushort *)(this->buffer + lVar4) = (ushort)*(uint *)data & 0x7f;
            *(ushort *)(this->buffer + lVar4 + 2) = (ushort)*(byte *)((long)data + 1);
            *(ushort *)(this->buffer + lVar4 + 4) = (ushort)*(byte *)((long)data + 2);
            *(ushort *)(this->buffer + lVar4 + 6) = (ushort)*(byte *)((long)data + 3);
            lVar4 = lVar4 + 8;
            data = (char_t *)((long)data + 4);
            size = size - 4;
          } while (3 < size);
        }
      }
    } while (size != 0);
    size = lVar4 - 0x800;
    if (xVar3 == encoding_utf16_le) goto LAB_0011bf17;
    if (lVar4 != 0x800) {
      lVar4 = 0;
      do {
        puVar1 = result->data_u16 + lVar4;
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        lVar4 = lVar4 + 1;
      } while ((long)size >> 1 != lVar4);
      goto LAB_0011bf17;
    }
    size = 0;
  }
  else {
    if (xVar3 - encoding_utf32_le < 2) {
      puVar5 = utf_decoder<pugi::impl::(anonymous_namespace)::utf32_writer,_pugi::impl::(anonymous_namespace)::opt_false>
               ::decode_utf8_block((uint8_t *)data,size,(value_type)result->data_u8);
      size = (long)puVar5 - (long)result->data_u8;
      if ((xVar3 != encoding_utf32_le) &&
         ((anon_union_8192_4_fbc60714_for_scratch *)puVar5 != result)) {
        lVar4 = 0;
        do {
          uVar8 = result->data_u32[lVar4];
          result->data_u32[lVar4] =
               uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
          lVar4 = lVar4 + 1;
        } while ((long)size >> 2 != lVar4);
      }
    }
    else {
      paVar6 = result;
      if (xVar3 != encoding_latin1) {
        __assert_fail("!\"Invalid encoding\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                      ,0xaf8,
                      "size_t pugi::impl::(anonymous namespace)::convert_buffer(char_t *, uint8_t *, uint16_t *, uint32_t *, const char_t *, size_t, xml_encoding)"
                     );
      }
      do {
        bVar2 = (byte)*(uint *)data;
        if ((char)bVar2 < '\0') {
          if ((((size < 3) || ((bVar2 & 0xf0) != 0xe0)) ||
              ((*(byte *)((long)data + 1) & 0xc0) != 0x80)) ||
             ((*(byte *)((long)data + 2) & 0xc0) != 0x80)) {
            data = (char_t *)((long)data + 1);
            size = size - 1;
          }
          else {
            uVar8 = (uint)*(byte *)((long)data + 1) << 6;
            bVar9 = *(byte *)((long)data + 2) & 0x3f | (byte)uVar8;
            if ((uVar8 & 0xf00) != 0 || (bVar2 & 0xf) != 0) {
              bVar9 = 0x3f;
            }
            paVar6->data_u8[0] = bVar9;
            paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar6 + 1);
            data = (char_t *)((long)data + 3);
            size = size - 3;
          }
        }
        else {
          paVar6->data_u8[0] = bVar2;
          paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar6->data_u8 + 1);
          data = (char_t *)((long)data + 1);
          size = size - 1;
          if ((3 < size) && (((ulong)data & 3) == 0)) {
            do {
              if ((*(uint *)data & 0x80808080) != 0) break;
              paVar6->data_u8[0] = (byte)*(uint *)data;
              paVar6->data_u8[1] = *(byte *)((long)data + 1);
              paVar6->data_u8[2] = *(byte *)((long)data + 2);
              paVar6->data_u8[3] = *(byte *)((long)data + 3);
              paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar6->data_u8 + 4);
              data = (char_t *)((long)data + 4);
              size = size - 4;
            } while (3 < size);
          }
        }
      } while (size != 0);
      size = (long)paVar6 - (long)result->data_u8;
    }
LAB_0011bf17:
    if (0x2000 < size) {
      __assert_fail("result <= sizeof(scratch)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                    ,0xb1e,
                    "void pugi::impl::(anonymous namespace)::xml_buffered_writer::flush(const char_t *, size_t)"
                   );
    }
  }
  pxVar7 = this->writer;
  UNRECOVERED_JUMPTABLE = pxVar7->_vptr_xml_writer[2];
LAB_0011bf34:
  (*UNRECOVERED_JUMPTABLE)(pxVar7,result,size);
  return;
}

Assistant:

void flush(const char_t* data, size_t size)
		{
			if (size == 0) return;

			// fast path, just write data
			if (encoding == get_write_native_encoding())
				writer.write(data, size * sizeof(char_t));
			else
			{
				// convert chunk
				size_t result = convert_buffer(scratch.data_char, scratch.data_u8, scratch.data_u16, scratch.data_u32, data, size, encoding);
				assert(result <= sizeof(scratch));

				// write data
				writer.write(scratch.data_u8, result);
			}
		}